

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O3

void * __thiscall LockedPool::alloc(LockedPool *this,size_t size)

{
  mutex *__mutex;
  long lVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  undefined8 uVar5;
  _List_node_base *p_Var6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = &this->mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    if (size - 0x40001 < 0xfffffffffffc0000) {
LAB_0040b316:
      pvVar4 = (void *)0x0;
    }
    else {
      p_Var6 = (_List_node_base *)&this->arenas;
      do {
        p_Var6 = (((_List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
                    *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var6 == (_List_node_base *)&this->arenas) {
          bVar2 = new_arena(this,0x40000,0x10);
          if (!bVar2) goto LAB_0040b316;
          pvVar4 = Arena::alloc((Arena *)((this->arenas).
                                          super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
                                          ._M_impl._M_node.super__List_node_base._M_prev + 1),size);
          break;
        }
        pvVar4 = Arena::alloc((Arena *)(p_Var6 + 1),size);
      } while (pvVar4 == (void *)0x0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return pvVar4;
    }
  }
  else if ((*(long *)(in_FS_OFFSET + 0x28) == lVar1) &&
          (uVar5 = std::__throw_system_error(iVar3), *(long *)(in_FS_OFFSET + 0x28) == lVar1)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  __stack_chk_fail();
}

Assistant:

void* LockedPool::alloc(size_t size)
{
    std::lock_guard<std::mutex> lock(mutex);

    // Don't handle impossible sizes
    if (size == 0 || size > ARENA_SIZE)
        return nullptr;

    // Try allocating from each current arena
    for (auto &arena: arenas) {
        void *addr = arena.alloc(size);
        if (addr) {
            return addr;
        }
    }
    // If that fails, create a new one
    if (new_arena(ARENA_SIZE, ARENA_ALIGN)) {
        return arenas.back().alloc(size);
    }
    return nullptr;
}